

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDyndepCollation.cxx
# Opt level: O2

bool __thiscall
cmDyndepCollation::WriteDyndepMetadata
          (cmDyndepCollation *this,string *lang,
          vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> *objects,
          cmCxxModuleExportInfo *export_info,cmDyndepMetadataCallbacks *cb)

{
  pointer *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a;
  pointer pcVar1;
  _Base_ptr p_Var2;
  pointer ppVar3;
  undefined8 uVar4;
  bool bVar5;
  ostream *poVar6;
  const_iterator cVar7;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_00;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar8;
  size_type sVar9;
  _Rb_tree_node_base *p_Var10;
  _Base_ptr p_Var11;
  byte bVar12;
  string *extraout_RDX;
  string *psVar13;
  string *extraout_RDX_00;
  string *extraout_RDX_01;
  string *extraout_RDX_02;
  string *extraout_RDX_03;
  pointer ppVar14;
  WrapQuotes wrapQuotes;
  pointer args;
  cmSourceReqInfo *p;
  value_type *provides;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar15;
  ostream *local_2c8;
  char local_2b9;
  _Base_ptr local_2b8;
  undefined4 local_2ac;
  _Base_ptr local_2a8;
  undefined4 local_29c;
  string bmi_path;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> m;
  string iface_source;
  vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
  exports;
  string install_bmi_path;
  string local_1d8;
  _Base_ptr local_1b8;
  _Base_ptr local_1b0;
  string *local_1a8;
  string *local_1a0;
  pointer *local_198;
  cmCxxModuleExportInfo *local_190;
  _Base_ptr local_188;
  string *local_180;
  _Base_ptr *local_178;
  string build_bmi_path;
  string bmi_destination;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  public_source_requires;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  private_modules;
  string local_d0;
  string config_upper;
  string local_90;
  string output_path;
  _Rb_tree_node_base local_50;
  
  __x._M_str = *(char **)this;
  __x._M_len = *(size_t *)(this + 8);
  __y._M_str = "CXX";
  __y._M_len = 3;
  local_190 = export_info;
  bVar5 = std::operator!=(__x,__y);
  bVar12 = 1;
  if (!bVar5) {
    s = &objects[10].super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_2b8 = (_Base_ptr)lang;
    cmsys::SystemTools::UpperCase(&config_upper,(string *)s);
    exports.
    super__Vector_base<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    exports.
    super__Vector_base<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    exports.
    super__Vector_base<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar1 = objects[9].super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    for (args = objects[9].super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>._M_impl
                .super__Vector_impl_data._M_finish; args != pcVar1;
        args = (pointer)&args[1].Provides.
                         super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>.
                         _M_impl.super__Vector_impl_data._M_finish) {
      m.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
      public_source_requires._M_t._M_impl._0_1_ = 0x2f;
      bmi_path._M_dataplus._M_p._0_1_ = 0x2f;
      cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&,char>
                ((string *)&private_modules,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(args->Provides).
                  super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
                  super__Vector_impl_data._M_finish,(char *)&public_source_requires,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(args->Requires).
                  super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(char *)&bmi_path);
      bmi_path._M_dataplus._M_p._0_1_ = 0x2d;
      cb = (cmDyndepMetadataCallbacks *)&bmi_path;
      cmStrCat<std::__cxx11::string_const&,char_const(&)[8],std::__cxx11::string_const&,char,std::__cxx11::string_const&,char_const(&)[7]>
                ((string *)&public_source_requires,(string *)&private_modules,(char (*) [8])0x69ee51
                 ,&args->PrimaryOutput,(char *)&bmi_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)s,
                 (char (*) [7])0x675140);
      std::make_unique<cmGeneratedFileStream,std::__cxx11::string_const&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bmi_path);
      uVar4 = m.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_dataplus._M_p;
      m.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus = bmi_path._M_dataplus;
      bmi_path._M_dataplus._M_p = (pointer)0x0;
      if (((pointer)uVar4 != (pointer)0x0) &&
         ((**(code **)(*(long *)uVar4 + 8))(), bmi_path._M_dataplus._M_p != (pointer)0x0)) {
        (**(code **)(*(long *)bmi_path._M_dataplus._M_p + 8))();
      }
      poVar6 = std::operator<<((ostream *)
                               m.
                               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ._M_payload._M_value._M_dataplus._M_p,"set_property(TARGET \"");
      poVar6 = std::operator<<(poVar6,(string *)(args[1].PrimaryOutput.field_2._M_local_buf + 8));
      poVar6 = std::operator<<(poVar6,(string *)args);
      poVar6 = std::operator<<(poVar6,"\"\n");
      poVar6 = std::operator<<(poVar6,"  PROPERTY IMPORTED_CXX_MODULES_");
      poVar6 = std::operator<<(poVar6,(string *)&config_upper);
      std::operator<<(poVar6,'\n');
      bmi_path._M_dataplus._M_p = (pointer)args;
      std::
      vector<std::pair<std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>,CxxModuleExport_const*>,std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>,CxxModuleExport_const*>>>
      ::
      emplace_back<std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>,CxxModuleExport_const*>
                ((vector<std::pair<std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>,CxxModuleExport_const*>,std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>,CxxModuleExport_const*>>>
                  *)&exports,
                 (unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *)
                 &m,(CxxModuleExport **)&bmi_path);
      std::__cxx11::string::~string((string *)&public_source_requires);
      std::__cxx11::string::~string((string *)&private_modules);
      if (m.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p != (pointer)0x0) {
        (**(code **)(*(long *)m.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._M_value._M_dataplus._M_p + 8))();
      }
    }
    if (*(char *)&objects[9].super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start == '\0') {
      local_2c8 = (ostream *)0x0;
    }
    else {
      std::make_unique<cmGeneratedFileStream,std::__cxx11::string_const&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &private_modules);
      local_2c8 = (ostream *)private_modules._M_t._M_impl._0_8_;
    }
    private_modules._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &private_modules._M_t._M_impl.super__Rb_tree_header._M_header;
    private_modules._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    private_modules._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    private_modules._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    public_source_requires._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &public_source_requires._M_t._M_impl.super__Rb_tree_header._M_header;
    public_source_requires._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    public_source_requires._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    public_source_requires._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1b0 = local_2b8->_M_parent;
    local_1b8 = (_Base_ptr)
                &(objects->super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
    local_198 = &objects[3].super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    local_1a0 = (string *)
                &objects[6].super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    local_1a8 = (string *)(objects + 5);
    local_2ac = (undefined4)CONCAT71((int7)((ulong)local_1a8 >> 8),1);
    p_Var11 = *(_Base_ptr *)local_2b8;
    public_source_requires._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         public_source_requires._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    private_modules._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         private_modules._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (ppVar3 = exports.
                    super__Vector_base<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
          ppVar14 = exports.
                    super__Vector_base<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, p_Var11 != local_1b0) {
      local_2a8 = p_Var11;
      std::__cxx11::string::string((string *)&output_path,(string *)p_Var11);
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
                      *)objects,&output_path);
      p_Var11 = local_2a8[1]._M_right;
      p_Var2 = *(_Base_ptr *)(local_2a8 + 2);
      if (cVar7._M_node == local_1b8) {
        if (p_Var11 != p_Var2) {
          cmStrCat<char_const(&)[8],std::__cxx11::string_const&,char_const(&)[16],std::__cxx11::string_const&,char_const(&)[67]>
                    ((string *)&m,(char (*) [8])0x69dcdf,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8,
                     (char (*) [16])" provides the `",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var11,
                     (char (*) [67])
                     "` module but it is not found in a `FILE_SET` of type `CXX_MODULES`");
          cmSystemTools::Error((string *)&m);
          cb = (cmDyndepMetadataCallbacks *)p_Var11;
          goto LAB_003090ef;
        }
      }
      else {
        __x_00._M_str = (char *)cVar7._M_node[5]._M_parent;
        __x_00._M_len = (size_t)cVar7._M_node[5]._M_left;
        __y_00._M_str = "CXX_MODULES";
        __y_00._M_len = 0xb;
        bVar5 = std::operator==(__x_00,__y_00);
        local_2b8 = cVar7._M_node;
        if (bVar5) {
          if (p_Var11 != p_Var2) {
LAB_0030893c:
            bVar5 = cmFileSetVisibilityIsForInterface
                              (*(cmFileSetVisibility *)&local_2b8[6]._M_parent);
            if (bVar5) {
              local_180 = (string *)&local_2b8[4]._M_parent;
              this_00 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         *)std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                           ::operator[](&public_source_requires,local_180);
              p_Var2 = local_2a8[2]._M_right;
              psVar13 = extraout_RDX;
              for (p_Var11 = local_2a8[2]._M_left; p_Var11 != p_Var2;
                  p_Var11 = (_Base_ptr)&p_Var11[3]._M_parent) {
                pVar15 = std::
                         _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         ::_M_insert_unique<std::__cxx11::string_const&>
                                   (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)p_Var11);
                psVar13 = pVar15._8_8_;
              }
              local_188 = *(_Base_ptr *)(local_2a8 + 2);
              local_178 = &local_2b8[6]._M_left;
              for (p_Var11 = local_2a8[1]._M_right; p_Var11 != local_188;
                  p_Var11 = (_Base_ptr)&p_Var11[3]._M_parent) {
                bmi_destination._M_dataplus._M_p = (pointer)&bmi_destination.field_2;
                bmi_destination._M_string_length = 0;
                bmi_destination.field_2._M_local_buf[0] = '\0';
                if (*(char *)&objects[9].
                              super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                              _M_impl.super__Vector_impl_data._M_start == '\x01') {
                  ppVar8 = WriteDyndepMetadata(std::__cxx11::string_const&,std::vector<cmScanDepInfo,std::allocator<cmScanDepInfo>>const&,cmCxxModuleExportInfo_const&,cmDyndepMetadataCallbacks_const&)
                           ::$_1::operator()::string_const___const
                                     ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&m,local_198,psVar13);
                  a = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&m.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload + 8);
                  local_29c = (undefined4)
                              CONCAT71((int7)((ulong)ppVar8 >> 8),
                                       m.
                                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                       ._M_payload.
                                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                       .
                                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ._M_payload._0_1_);
                  install_bmi_path._M_dataplus._M_p._0_1_ = 0x2f;
                  cmStrCat<std::__cxx11::string&,char>(&bmi_path,a,(char *)&install_bmi_path);
                  std::__cxx11::string::operator=((string *)&bmi_destination,(string *)&bmi_path);
                  std::__cxx11::string::~string((string *)&bmi_path);
                  std::__cxx11::string::~string((string *)a);
                }
                else {
                  local_29c = 0;
                }
                install_bmi_path._M_dataplus._M_p = (pointer)&install_bmi_path.field_2;
                install_bmi_path._M_string_length = 0;
                install_bmi_path.field_2._M_local_buf[0] = '\0';
                build_bmi_path._M_dataplus._M_p = (pointer)&build_bmi_path.field_2;
                build_bmi_path._M_string_length = 0;
                build_bmi_path.field_2._M_local_buf[0] = '\0';
                std::
                function<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::operator()(&m,(function<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                 *)local_190,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             p_Var11);
                psVar13 = extraout_RDX_00;
                ppVar14 = exports.
                          super__Vector_base<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                ppVar3 = exports.
                         super__Vector_base<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                if (m.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_engaged == true) {
                  cmsys::SystemTools::GetFilenameName(&local_1d8,(string *)&m);
                  str._M_str = (char *)0x1;
                  str._M_len = (size_t)local_1d8._M_dataplus._M_p;
                  cmOutputConverter::EscapeForCMake_abi_cxx11_
                            (&iface_source,(cmOutputConverter *)local_1d8._M_string_length,str,
                             (WrapQuotes)cb);
                  cmStrCat<std::__cxx11::string&,std::__cxx11::string>
                            (&bmi_path,&bmi_destination,&iface_source);
                  std::__cxx11::string::operator=((string *)&install_bmi_path,(string *)&bmi_path);
                  std::__cxx11::string::~string((string *)&bmi_path);
                  std::__cxx11::string::~string((string *)&iface_source);
                  std::__cxx11::string::~string((string *)&local_1d8);
                  str_00._M_str = (char *)0x1;
                  str_00._M_len =
                       (size_t)m.
                               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ._M_payload._M_value._M_dataplus._M_p;
                  cmOutputConverter::EscapeForCMake_abi_cxx11_
                            (&bmi_path,
                             (cmOutputConverter *)
                             m.
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload._M_value._M_string_length,str_00,(WrapQuotes)cb);
                  std::__cxx11::string::operator=((string *)&build_bmi_path,(string *)&bmi_path);
                  std::__cxx11::string::~string((string *)&bmi_path);
                  psVar13 = extraout_RDX_01;
                  ppVar14 = exports.
                            super__Vector_base<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  ppVar3 = exports.
                           super__Vector_base<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                }
                for (; wrapQuotes = (WrapQuotes)cb, ppVar14 != ppVar3; ppVar14 = ppVar14 + 1) {
                  iface_source._M_dataplus._M_p = (pointer)&iface_source.field_2;
                  iface_source._M_string_length = 0;
                  iface_source.field_2._M_local_buf[0] = '\0';
                  if ((ppVar14->second->Install == true) &&
                     (*(char *)&local_2b8[7]._M_left == '\x01')) {
                    WriteDyndepMetadata(std::__cxx11::string_const&,std::vector<cmScanDepInfo,std::allocator<cmScanDepInfo>>const&,cmCxxModuleExportInfo_const&,cmDyndepMetadataCallbacks_const&)
                    ::$_1::operator()::string_const___const
                              ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&bmi_path,local_178,psVar13);
                    local_2b9 = '/';
                    str_01._M_str = (char *)0x1;
                    str_01._M_len = (size_t)local_2b8[3]._M_parent;
                    cmOutputConverter::EscapeForCMake_abi_cxx11_
                              (&local_90,(cmOutputConverter *)local_2b8[3]._M_left,str_01,wrapQuotes
                              );
                    cmsys::SystemTools::GetFilenameName(&local_d0,local_180);
                    str_02._M_str = (char *)0x1;
                    str_02._M_len = (size_t)local_d0._M_dataplus._M_p;
                    cmOutputConverter::EscapeForCMake_abi_cxx11_
                              ((string *)&local_50,(cmOutputConverter *)local_d0._M_string_length,
                               str_02,wrapQuotes);
                    cb = (cmDyndepMetadataCallbacks *)&local_50;
                    cmStrCat<std::__cxx11::string&,char,std::__cxx11::string,std::__cxx11::string>
                              (&local_1d8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &bmi_path._M_string_length,&local_2b9,&local_90,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_50);
                    std::__cxx11::string::operator=((string *)&iface_source,(string *)&local_1d8);
                    std::__cxx11::string::~string((string *)&local_1d8);
                    std::__cxx11::string::~string((string *)&local_50);
                    std::__cxx11::string::~string((string *)&local_d0);
                    std::__cxx11::string::~string((string *)&local_90);
                    std::__cxx11::string::~string((string *)&bmi_path._M_string_length);
                  }
                  else {
                    str_03._M_str = (char *)0x1;
                    str_03._M_len = (size_t)local_2b8[4]._M_parent;
                    cmOutputConverter::EscapeForCMake_abi_cxx11_
                              (&bmi_path,(cmOutputConverter *)local_2b8[4]._M_left,str_03,wrapQuotes
                              );
                    std::__cxx11::string::operator=((string *)&iface_source,(string *)&bmi_path);
                    std::__cxx11::string::~string((string *)&bmi_path);
                  }
                  bmi_path._M_dataplus._M_p = (pointer)&bmi_path.field_2;
                  bmi_path._M_string_length = 0;
                  bmi_path.field_2._M_local_buf[0] = '\0';
                  if ((ppVar14->second->Install != true) ||
                     (*(char *)&objects[9].
                                super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                                _M_impl.super__Vector_impl_data._M_start != '\0')) {
                    std::__cxx11::string::_M_assign((string *)&bmi_path);
                  }
                  if (iface_source._M_string_length != 0) {
                    poVar6 = std::operator<<((ostream *)
                                             (ppVar14->first)._M_t.
                                             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                                             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>.
                                             _M_head_impl,"    \"");
                    str_04._M_str = (char *)0x1;
                    str_04._M_len = *(size_t *)p_Var11;
                    cmOutputConverter::EscapeForCMake_abi_cxx11_
                              (&local_1d8,(cmOutputConverter *)p_Var11->_M_parent,str_04,
                               (WrapQuotes)cb);
                    poVar6 = std::operator<<(poVar6,(string *)&local_1d8);
                    poVar6 = std::operator<<(poVar6,'=');
                    std::operator<<(poVar6,(string *)&iface_source);
                    std::__cxx11::string::~string((string *)&local_1d8);
                    if (bmi_path._M_string_length != 0) {
                      poVar6 = std::operator<<((ostream *)
                                               (ppVar14->first)._M_t.
                                               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                                               .
                                               super__Head_base<0UL,_cmGeneratedFileStream_*,_false>
                                               ._M_head_impl,',');
                      std::operator<<(poVar6,(string *)&bmi_path);
                    }
                    std::operator<<((ostream *)
                                    (ppVar14->first)._M_t.
                                    super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                                    .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>.
                                    _M_head_impl,"\"\n");
                  }
                  std::__cxx11::string::~string((string *)&bmi_path);
                  std::__cxx11::string::~string((string *)&iface_source);
                  psVar13 = extraout_RDX_02;
                }
                if (local_2c8 != (ostream *)0x0) {
                  poVar6 = std::operator<<(local_2c8,"if (CMAKE_INSTALL_COMPONENT STREQUAL \"");
                  str_05._M_str = (char *)0x1;
                  str_05._M_len =
                       (size_t)objects[2].
                               super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                  cmOutputConverter::EscapeForCMake_abi_cxx11_
                            (&bmi_path,
                             (cmOutputConverter *)
                             objects[2].
                             super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                             _M_impl.super__Vector_impl_data._M_finish,str_05,(WrapQuotes)cb);
                  poVar6 = std::operator<<(poVar6,(string *)&bmi_path);
                  std::operator<<(poVar6,'\"');
                  std::__cxx11::string::~string((string *)&bmi_path);
                  if (*(char *)&objects[4].
                                super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
                    std::operator<<(local_2c8," OR NOT CMAKE_INSTALL_COMPONENT");
                  }
                  std::operator<<(local_2c8,")\n");
                  std::operator<<(local_2c8,"  file(INSTALL\n    DESTINATION \"");
                  if ((char)local_29c == '\0') {
                    std::operator<<(local_2c8,"${CMAKE_INSTALL_PREFIX}/");
                  }
                  str_06._M_str = (char *)0x1;
                  str_06._M_len =
                       (size_t)objects[3].
                               super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                  cmOutputConverter::EscapeForCMake_abi_cxx11_
                            (&bmi_path,
                             (cmOutputConverter *)
                             objects[3].
                             super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,str_06,(WrapQuotes)cb
                            );
                  poVar6 = std::operator<<(local_2c8,(string *)&bmi_path);
                  std::operator<<(poVar6,"\"\n    TYPE FILE\n");
                  std::__cxx11::string::~string((string *)&bmi_path);
                  if (*(char *)((long)&objects[4].
                                       super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) ==
                      '\x01') {
                    std::operator<<(local_2c8,"    OPTIONAL\n");
                  }
                  if (objects[6].super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                    poVar6 = std::operator<<(local_2c8,"    ");
                    poVar6 = std::operator<<(poVar6,local_1a0);
                    std::operator<<(poVar6,"\n");
                  }
                  if (objects[5].super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                    poVar6 = std::operator<<(local_2c8,"    PERMISSIONS");
                    poVar6 = std::operator<<(poVar6,local_1a8);
                    std::operator<<(poVar6,"\n");
                  }
                  poVar6 = std::operator<<(local_2c8,"    FILES \"");
                  poVar6 = std::operator<<(poVar6,(string *)&m);
                  std::operator<<(poVar6,"\")\n");
                  if ((char)local_29c != '\0') {
                    poVar6 = std::operator<<(local_2c8,
                                             "  list(APPEND CMAKE_ABSOLUTE_DESTINATION_FILES\n    \""
                                            );
                    cmsys::SystemTools::GetFilenameName(&iface_source,(string *)&m);
                    str_07._M_str = (char *)0x1;
                    str_07._M_len = (size_t)iface_source._M_dataplus._M_p;
                    cmOutputConverter::EscapeForCMake_abi_cxx11_
                              (&bmi_path,(cmOutputConverter *)iface_source._M_string_length,str_07,
                               (WrapQuotes)cb);
                    poVar6 = std::operator<<(poVar6,(string *)&bmi_path);
                    std::operator<<(poVar6,
                                    "\")\n  if (CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION)\n    message(WARNING\n      \"ABSOLUTE path INSTALL DESTINATION : ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n  endif ()\n  if (CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION)\n    message(FATAL_ERROR\n      \"ABSOLUTE path INSTALL DESTINATION forbidden (by caller): ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n  endif ()\n"
                                   );
                    std::__cxx11::string::~string((string *)&bmi_path);
                    std::__cxx11::string::~string((string *)&iface_source);
                  }
                  std::operator<<(local_2c8,"endif ()\n");
                }
                std::
                _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&m);
                std::__cxx11::string::~string((string *)&build_bmi_path);
                std::__cxx11::string::~string((string *)&install_bmi_path);
                std::__cxx11::string::~string((string *)&bmi_destination);
                psVar13 = extraout_RDX_03;
              }
            }
            else {
              p_Var2 = *(_Base_ptr *)(local_2a8 + 2);
              for (p_Var11 = local_2a8[1]._M_right; p_Var11 != p_Var2;
                  p_Var11 = (_Base_ptr)&p_Var11[3]._M_parent) {
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&private_modules,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           p_Var11);
              }
            }
            goto LAB_003090ff;
          }
          cmStrCat<char_const(&)[8],std::__cxx11::string_const&,char_const(&)[84]>
                    ((string *)&m,(char (*) [8])0x69dcdf,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8,
                     (char (*) [84])
                     " is of type `CXX_MODULES` but does not provide a module interface unit or partition"
                    );
          cmSystemTools::Error((string *)&m);
        }
        else {
          __x_01._M_str = (char *)cVar7._M_node[5]._M_parent;
          __x_01._M_len = (size_t)cVar7._M_node[5]._M_left;
          __y_01._M_str = "CXX_MODULE_HEADERS";
          __y_01._M_len = 0x12;
          bVar5 = std::operator==(__x_01,__y_01);
          if (bVar5) goto LAB_0030893c;
          if (p_Var11 == p_Var2) goto LAB_003090ff;
          cb = (cmDyndepMetadataCallbacks *)local_2a8[1]._M_right;
          cmStrCat<char_const(&)[8],std::__cxx11::string_const&,char_const(&)[16],std::__cxx11::string_const&,char_const(&)[30],std::__cxx11::string_const&,char_const(&)[43]>
                    ((string *)&m,(char (*) [8])"Source ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_2b8[4]._M_parent,(char (*) [16])" provides the `",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)cb,
                     (char (*) [30])"` C++ module but is of type `",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_2b8[5]._M_parent,
                     (char (*) [43])"` module but must be of type `CXX_MODULES`");
          cmSystemTools::Error((string *)&m);
        }
LAB_003090ef:
        std::__cxx11::string::~string((string *)&m);
        local_2ac = 0;
      }
LAB_003090ff:
      std::__cxx11::string::~string((string *)&output_path);
      p_Var11 = (_Base_ptr)&local_2a8[3]._M_parent;
    }
    for (; ppVar14 != ppVar3; ppVar14 = ppVar14 + 1) {
      std::operator<<((ostream *)
                      (ppVar14->first)._M_t.
                      super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                      .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,")\n");
    }
    p_Var11 = public_source_requires._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var11 != &public_source_requires._M_t._M_impl.super__Rb_tree_header)
    {
      local_2b8 = p_Var11;
      for (p_Var10 = p_Var11[2]._M_right; p_Var10 != (_Rb_tree_node_base *)&p_Var11[2]._M_parent;
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
        sVar9 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&private_modules,(key_type *)(p_Var10 + 1));
        if (sVar9 != 0) {
          cmStrCat<char_const(&)[27],std::__cxx11::string_const&,char_const(&)[17],std::__cxx11::string_const&,char_const(&)[51]>
                    ((string *)&m,(char (*) [27])"Public C++ module source `",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var11 + 1),(char (*) [17])"` requires the `",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var10 + 1),
                     (char (*) [51])"` C++ module which is provided by a private source");
          cmSystemTools::Error((string *)&m);
          std::__cxx11::string::~string((string *)&m);
          local_2ac = 0;
        }
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(local_2b8);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&public_source_requires._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&private_modules._M_t);
    if (local_2c8 != (ostream *)0x0) {
      (*local_2c8->_vptr_basic_ostream[1])();
    }
    std::
    vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
    ::~vector(&exports);
    std::__cxx11::string::~string((string *)&config_upper);
    bVar12 = (byte)local_2ac;
  }
  return (bool)(bVar12 & 1);
}

Assistant:

bool cmDyndepCollation::WriteDyndepMetadata(
  std::string const& lang, std::vector<cmScanDepInfo> const& objects,
  cmCxxModuleExportInfo const& export_info,
  cmDyndepMetadataCallbacks const& cb)
{
  // Only C++ supports any of the file-set or BMI installation considered
  // below.
  if (lang != "CXX"_s) {
    return true;
  }

  bool result = true;

  // Prepare the export information blocks.
  std::string const config_upper =
    cmSystemTools::UpperCase(export_info.Config);
  std::vector<
    std::pair<std::unique_ptr<cmGeneratedFileStream>, CxxModuleExport const*>>
    exports;
  for (auto const& exp : export_info.Exports) {
    std::unique_ptr<cmGeneratedFileStream> properties;

    std::string const export_dir =
      cmStrCat(exp.Prefix, '/', exp.CxxModuleInfoDir, '/');
    std::string const property_file_path = cmStrCat(
      export_dir, "target-", exp.Name, '-', export_info.Config, ".cmake");
    properties = cm::make_unique<cmGeneratedFileStream>(property_file_path);

    // Set up the preamble.
    *properties << "set_property(TARGET \"" << exp.Namespace << exp.Name
                << "\"\n"
                << "  PROPERTY IMPORTED_CXX_MODULES_" << config_upper << '\n';

    exports.emplace_back(std::move(properties), &exp);
  }

  std::unique_ptr<cmGeneratedFileStream> bmi_install_script;
  if (export_info.BmiInstallation) {
    bmi_install_script = cm::make_unique<cmGeneratedFileStream>(
      export_info.BmiInstallation->ScriptLocation);
  }

  auto cmEscape = [](cm::string_view str) {
    return cmOutputConverter::EscapeForCMake(
      str, cmOutputConverter::WrapQuotes::NoWrap);
  };
  auto install_destination =
    [&cmEscape](std::string const& dest) -> std::pair<bool, std::string> {
    if (cmSystemTools::FileIsFullPath(dest)) {
      return std::make_pair(true, cmEscape(dest));
    }
    return std::make_pair(false,
                          cmStrCat("${_IMPORT_PREFIX}/", cmEscape(dest)));
  };

  // public/private requirement tracking.
  std::set<std::string> private_modules;
  std::map<std::string, std::set<std::string>> public_source_requires;

  for (cmScanDepInfo const& object : objects) {
    // Convert to forward slashes.
    auto output_path = object.PrimaryOutput;
#ifdef _WIN32
    cmSystemTools::ConvertToUnixSlashes(output_path);
#endif
    // Find the fileset for this object.
    auto fileset_info_itr = export_info.ObjectToFileSet.find(output_path);
    bool const has_provides = !object.Provides.empty();
    if (fileset_info_itr == export_info.ObjectToFileSet.end()) {
      // If it provides anything, it should have type `CXX_MODULES`
      // and be present.
      if (has_provides) {
        // Take the first module provided to provide context.
        auto const& provides = object.Provides[0];
        cmSystemTools::Error(
          cmStrCat("Output ", object.PrimaryOutput, " provides the `",
                   provides.LogicalName,
                   "` module but it is not found in a `FILE_SET` of type "
                   "`CXX_MODULES`"));
        result = false;
      }

      // This object file does not provide anything, so nothing more needs to
      // be done.
      continue;
    }

    auto const& file_set = fileset_info_itr->second;

    // Verify the fileset type for the object.
    if (file_set.Type == "CXX_MODULES"_s) {
      if (!has_provides) {
        cmSystemTools::Error(
          cmStrCat("Output ", object.PrimaryOutput,
                   " is of type `CXX_MODULES` but does not provide a module "
                   "interface unit or partition"));
        result = false;
        continue;
      }
    } else if (file_set.Type == "CXX_MODULE_HEADERS"_s) {
      // TODO.
    } else {
      if (has_provides) {
        auto const& provides = object.Provides[0];
        cmSystemTools::Error(cmStrCat(
          "Source ", file_set.SourcePath, " provides the `",
          provides.LogicalName, "` C++ module but is of type `", file_set.Type,
          "` module but must be of type `CXX_MODULES`"));
        result = false;
      }

      // Not a C++ module; ignore.
      continue;
    }

    if (!cmFileSetVisibilityIsForInterface(file_set.Visibility)) {
      // Nothing needs to be conveyed about non-`PUBLIC` modules.
      for (auto const& p : object.Provides) {
        private_modules.insert(p.LogicalName);
      }
      continue;
    }

    // The module is public. Record what it directly requires.
    {
      auto& reqs = public_source_requires[file_set.SourcePath];
      for (auto const& r : object.Requires) {
        reqs.insert(r.LogicalName);
      }
    }

    // Write out properties and install rules for any exports.
    for (auto const& p : object.Provides) {
      bool bmi_dest_is_abs = false;
      std::string bmi_destination;
      if (export_info.BmiInstallation) {
        auto dest =
          install_destination(export_info.BmiInstallation->Destination);
        bmi_dest_is_abs = dest.first;
        bmi_destination = cmStrCat(dest.second, '/');
      }

      std::string install_bmi_path;
      std::string build_bmi_path;
      auto m = cb.ModuleFile(p.LogicalName);
      if (m) {
        install_bmi_path = cmStrCat(
          bmi_destination, cmEscape(cmSystemTools::GetFilenameName(*m)));
        build_bmi_path = cmEscape(*m);
      }

      for (auto const& exp : exports) {
        std::string iface_source;
        if (exp.second->Install && file_set.Destination) {
          auto dest = install_destination(*file_set.Destination);
          iface_source = cmStrCat(
            dest.second, '/', cmEscape(file_set.RelativeDirectory),
            cmEscape(cmSystemTools::GetFilenameName(file_set.SourcePath)));
        } else {
          iface_source = cmEscape(file_set.SourcePath);
        }

        std::string bmi_path;
        if (exp.second->Install && export_info.BmiInstallation) {
          bmi_path = install_bmi_path;
        } else if (!exp.second->Install) {
          bmi_path = build_bmi_path;
        }

        if (iface_source.empty()) {
          // No destination for the C++ module source; ignore this property
          // value.
          continue;
        }

        *exp.first << "    \"" << cmEscape(p.LogicalName) << '='
                   << iface_source;
        if (!bmi_path.empty()) {
          *exp.first << ',' << bmi_path;
        }
        *exp.first << "\"\n";
      }

      if (bmi_install_script) {
        auto const& bmi_install = *export_info.BmiInstallation;

        *bmi_install_script << "if (CMAKE_INSTALL_COMPONENT STREQUAL \""
                            << cmEscape(bmi_install.Component) << '\"';
        if (!bmi_install.ExcludeFromAll) {
          *bmi_install_script << " OR NOT CMAKE_INSTALL_COMPONENT";
        }
        *bmi_install_script << ")\n";
        *bmi_install_script << "  file(INSTALL\n"
                               "    DESTINATION \"";
        if (!bmi_dest_is_abs) {
          *bmi_install_script << "${CMAKE_INSTALL_PREFIX}/";
        }
        *bmi_install_script << cmEscape(bmi_install.Destination)
                            << "\"\n"
                               "    TYPE FILE\n";
        if (bmi_install.Optional) {
          *bmi_install_script << "    OPTIONAL\n";
        }
        if (!bmi_install.MessageLevel.empty()) {
          *bmi_install_script << "    " << bmi_install.MessageLevel << "\n";
        }
        if (!bmi_install.Permissions.empty()) {
          *bmi_install_script << "    PERMISSIONS" << bmi_install.Permissions
                              << "\n";
        }
        *bmi_install_script << "    FILES \"" << *m << "\")\n";
        if (bmi_dest_is_abs) {
          *bmi_install_script
            << "  list(APPEND CMAKE_ABSOLUTE_DESTINATION_FILES\n"
               "    \""
            << cmEscape(cmSystemTools::GetFilenameName(*m))
            << "\")\n"
               "  if (CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION)\n"
               "    message(WARNING\n"
               "      \"ABSOLUTE path INSTALL DESTINATION : "
               "${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n"
               "  endif ()\n"
               "  if (CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION)\n"
               "    message(FATAL_ERROR\n"
               "      \"ABSOLUTE path INSTALL DESTINATION forbidden (by "
               "caller): ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n"
               "  endif ()\n";
        }
        *bmi_install_script << "endif ()\n";
      }
    }
  }

  // Add trailing parenthesis for the `set_property` call.
  for (auto const& exp : exports) {
    *exp.first << ")\n";
  }

  // Check that public sources only require public modules.
  for (auto const& pub_reqs : public_source_requires) {
    for (auto const& req : pub_reqs.second) {
      if (private_modules.count(req)) {
        cmSystemTools::Error(cmStrCat(
          "Public C++ module source `", pub_reqs.first, "` requires the `",
          req, "` C++ module which is provided by a private source"));
        result = false;
      }
    }
  }

  return result;
}